

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_description-c.cpp
# Opt level: O1

void duckdb_table_description_destroy(duckdb_table_description *table)

{
  default_delete<duckdb::TableDescription> *this;
  pointer *__ptr;
  
  if ((table != (duckdb_table_description *)0x0) &&
     (this = (default_delete<duckdb::TableDescription> *)*table,
     this != (default_delete<duckdb::TableDescription> *)0x0)) {
    if (*(default_delete<duckdb::TableDescription> **)(this + 8) != this + 0x18) {
      operator_delete(*(default_delete<duckdb::TableDescription> **)(this + 8));
    }
    if (*(TableDescription **)this != (TableDescription *)0x0) {
      std::default_delete<duckdb::TableDescription>::operator()(this,*(TableDescription **)this);
    }
    *(undefined8 *)this = 0;
    operator_delete(this);
    *table = (duckdb_table_description)0x0;
  }
  return;
}

Assistant:

void duckdb_table_description_destroy(duckdb_table_description *table) {
	if (!table || !*table) {
		return;
	}
	auto wrapper = reinterpret_cast<TableDescriptionWrapper *>(*table);
	delete wrapper;
	*table = nullptr;
}